

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvgrast.h
# Opt level: O1

void nsvg__fillScanline(uchar *scanline,int len,int x0,int x1,int maxWeight,int *xmin,int *xmax)

{
  uint uVar1;
  ulong uVar2;
  undefined4 in_register_00000084;
  uint uVar3;
  
  uVar1 = x0 >> 10;
  uVar3 = x1 >> 10;
  if ((int)uVar1 < (int)*(uint *)CONCAT44(in_register_00000084,maxWeight)) {
    *(uint *)CONCAT44(in_register_00000084,maxWeight) = uVar1;
  }
  if (*xmin < (int)uVar3) {
    *xmin = uVar3;
  }
  if (-1 < (int)uVar3 && (int)uVar1 < len) {
    if (uVar1 == uVar3) {
      scanline[uVar1] = scanline[uVar1] + (char)((uint)((x1 - x0) * 0x33) >> 10);
      return;
    }
    if ((int)uVar1 < 0) {
      uVar1 = 0;
    }
    else {
      scanline[uVar1] = scanline[uVar1] + (char)((0x400 - (x0 & 0x3ffU)) * 0x33 >> 10);
      uVar1 = uVar1 + 1;
    }
    if ((int)uVar3 < len) {
      scanline[uVar3] = scanline[uVar3] + (char)((x1 & 0x3ffU) * 0x33 >> 10);
      len = uVar3;
    }
    if ((int)uVar1 < len) {
      uVar2 = (ulong)uVar1;
      do {
        scanline[uVar2] = scanline[uVar2] + '3';
        uVar2 = uVar2 + 1;
      } while ((long)uVar2 < (long)len);
    }
  }
  return;
}

Assistant:

static void nsvg__fillScanline(unsigned char* scanline, int len, int x0, int x1, int maxWeight, int* xmin, int* xmax)
{
	int i = x0 >> NSVG__FIXSHIFT;
	int j = x1 >> NSVG__FIXSHIFT;
	if (i < *xmin) *xmin = i;
	if (j > *xmax) *xmax = j;
	if (i < len && j >= 0) {
		if (i == j) {
			// x0,x1 are the same pixel, so compute combined coverage
			scanline[i] = (unsigned char)(scanline[i] + ((x1 - x0) * maxWeight >> NSVG__FIXSHIFT));
		} else {
			if (i >= 0) // add antialiasing for x0
				scanline[i] = (unsigned char)(scanline[i] + (((NSVG__FIX - (x0 & NSVG__FIXMASK)) * maxWeight) >> NSVG__FIXSHIFT));
			else
				i = -1; // clip

			if (j < len) // add antialiasing for x1
				scanline[j] = (unsigned char)(scanline[j] + (((x1 & NSVG__FIXMASK) * maxWeight) >> NSVG__FIXSHIFT));
			else
				j = len; // clip

			for (++i; i < j; ++i) // fill pixels between x0 and x1
				scanline[i] = (unsigned char)(scanline[i] + maxWeight);
		}
	}
}